

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.c
# Opt level: O2

interp_t * interp_init(char *file,logmath_t *logmath)

{
  bool bVar1;
  int32 iVar2;
  int iVar3;
  int32 iVar4;
  interp_t *piVar5;
  FILE *pFVar6;
  interp_wt_s *piVar7;
  size_t sVar8;
  char *pcVar9;
  long lVar10;
  int32 *buf;
  ulong uVar11;
  long lStackY_80;
  int32 byteswap;
  char eofchk;
  uint32 local_60;
  float f;
  char **argval;
  interp_t *local_50;
  FILE *local_48;
  char **argname;
  interp_t *local_38;
  
  if (file == (char *)0x0) {
    __assert_fail("file != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/interp.c"
                  ,0x9a,"interp_t *interp_init(const char *, logmath_t *)");
  }
  piVar5 = (interp_t *)
           __ckd_calloc__(1,0x18,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/interp.c"
                          ,0x9c);
  piVar5->logmath = logmath;
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/interp.c"
          ,0x58,"Reading interpolation weights: %s\n",file);
  pFVar6 = fopen(file,"rb");
  if (pFVar6 == (FILE *)0x0) {
    err_msg_system(ERR_FATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/interp.c"
                   ,0x5b,"fopen(%s,rb) failed\n",file);
  }
  else {
    local_48 = pFVar6;
    iVar2 = bio_readhdr((FILE *)pFVar6,&argname,&argval,&byteswap);
    if (iVar2 < 0) {
      pcVar9 = "bio_readhdr(%s) failed\n";
      lStackY_80 = 0x5f;
    }
    else {
      bVar1 = false;
      local_50 = piVar5;
      local_38 = piVar5;
      for (lVar10 = 0; pcVar9 = *(char **)((long)argname + lVar10), pcVar9 != (char *)0x0;
          lVar10 = lVar10 + 8) {
        iVar3 = strcmp(pcVar9,"version");
        if (iVar3 == 0) {
          pcVar9 = *(char **)((long)argval + lVar10);
          iVar3 = strcmp(pcVar9,"1.0");
          piVar5 = local_50;
          if (iVar3 != 0) {
            err_msg(ERR_WARN,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/interp.c"
                    ,0x67,"Version mismatch(%s): %s, expecting %s\n",file,pcVar9,"1.0");
            piVar5 = local_50;
          }
        }
        else {
          iVar3 = strcmp(pcVar9,"chksum0");
          if (iVar3 == 0) {
            bVar1 = true;
          }
        }
      }
      bio_hdrarg_free(argname,argval);
      pFVar6 = local_48;
      argval = (char **)0x0;
      argname = (char **)0x0;
      local_60 = 0;
      buf = &local_38->n_sen;
      iVar2 = bio_fread(buf,4,1,(FILE *)local_48,byteswap,&local_60);
      if (iVar2 == 1) {
        if ((long)*buf < 1) {
          err_msg(ERR_FATAL,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/interp.c"
                  ,0x77,"%s: arraysize= %d in header\n",file);
          goto LAB_0010f4e9;
        }
        piVar7 = (interp_wt_s *)
                 __ckd_calloc__((long)*buf,8,
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/interp.c"
                                ,0x7b);
        piVar5->wt = piVar7;
        for (uVar11 = 0; (long)uVar11 < (long)*buf; uVar11 = uVar11 + 1) {
          iVar2 = bio_fread(&f,4,1,(FILE *)pFVar6,byteswap,&local_60);
          if (iVar2 != 1) {
            pcVar9 = "fread(%s) (arraydata) failed\n";
            lStackY_80 = 0x7f;
            goto LAB_0010f4b6;
          }
          if ((f < 0.0) || (1.0 < f)) {
            err_msg(ERR_FATAL,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/interp.c"
                    ,0x81,"%s: interpolation weight(%d)= %e\n",file,uVar11 & 0xffffffff);
            goto LAB_0010f4e9;
          }
          iVar4 = -0x38000000;
          iVar2 = -0x38000000;
          if ((f != 0.0) || (NAN(f))) {
            iVar2 = logs3(piVar5->logmath,(float64)(double)f);
          }
          piVar7 = piVar5->wt;
          piVar7[uVar11].cd = iVar2;
          if ((f != 1.0) || (NAN(f))) {
            iVar4 = logs3(piVar5->logmath,(float64)(1.0 - (double)f));
            piVar7 = piVar5->wt;
          }
          piVar7[uVar11].ci = iVar4;
          pFVar6 = local_48;
        }
        if (bVar1) {
          bio_verify_chksum((FILE *)pFVar6,byteswap,local_60);
        }
        sVar8 = fread(&eofchk,1,1,pFVar6);
        if (sVar8 != 1) {
          fclose(pFVar6);
          err_msg(ERR_INFO,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/interp.c"
                  ,0x8f,"Read %d interpolation weights\n",(ulong)(uint)piVar5->n_sen);
          return piVar5;
        }
        pcVar9 = "More data than expected in %s\n";
        lStackY_80 = 0x8b;
      }
      else {
        pcVar9 = "fread(%s) (arraysize) failed\n";
        lStackY_80 = 0x75;
      }
    }
LAB_0010f4b6:
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/interp.c"
            ,lStackY_80,pcVar9,file);
  }
LAB_0010f4e9:
  exit(1);
}

Assistant:

interp_t *
interp_init(const char *file, logmath_t *logmath)
{
    interp_t *ip;

    assert(file != NULL);

    ip = (interp_t *) ckd_calloc(1, sizeof(interp_t));
    ip->logmath = logmath;

    if (interp_read(ip, file) != 1)
        E_FATAL("interp_init(%s) failed\n", file);

    return ip;
}